

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacProj.cpp
# Opt level: O0

void __thiscall
MacProj::set_mac_solve_bc
          (MacProj *this,Array<MLLinOp::BCType,_3> *mlmg_lobc,Array<MLLinOp::BCType,_3> *mlmg_hibc,
          BCRec *a_phys_bc,Geometry *geom)

{
  bool bVar1;
  reference pvVar2;
  long in_RCX;
  Geometry *in_R8;
  int idim;
  size_type in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int dir;
  
  for (dir = 0; dir < 3; dir = dir + 1) {
    bVar1 = amrex::Geometry::isPeriodic(in_R8,dir);
    if (bVar1) {
      pvVar2 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
      *pvVar2 = Periodic;
      pvVar2 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                         ((array<amrex::LinOpBCType,_3UL> *)CONCAT44(dir,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
      *pvVar2 = Periodic;
    }
    else {
      if (*(int *)(in_RCX + (long)dir * 4) == 2) {
        pvVar2 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)
                            CONCAT44(dir,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
        *pvVar2 = Dirichlet;
      }
      else {
        pvVar2 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)
                            CONCAT44(dir,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
        *pvVar2 = Neumann;
      }
      if (*(int *)(in_RCX + (long)(dir + 3) * 4) == 2) {
        pvVar2 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)
                            CONCAT44(dir,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
        *pvVar2 = Dirichlet;
      }
      else {
        pvVar2 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                           ((array<amrex::LinOpBCType,_3UL> *)
                            CONCAT44(dir,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
        *pvVar2 = Neumann;
      }
    }
  }
  return;
}

Assistant:

void
MacProj::set_mac_solve_bc (Array<MLLinOp::BCType,AMREX_SPACEDIM>& mlmg_lobc,
			   Array<MLLinOp::BCType,AMREX_SPACEDIM>& mlmg_hibc,
			   const BCRec& a_phys_bc, const Geometry& geom)
{
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            mlmg_lobc[idim] = MLLinOp::BCType::Periodic;
            mlmg_hibc[idim] = MLLinOp::BCType::Periodic;
        } else {
            if (a_phys_bc.lo(idim) == Outflow) {
                mlmg_lobc[idim] = MLLinOp::BCType::Dirichlet;
            } else {
                mlmg_lobc[idim] = MLLinOp::BCType::Neumann;
            }
            if (a_phys_bc.hi(idim) == Outflow) {
                mlmg_hibc[idim] = MLLinOp::BCType::Dirichlet;
            } else {
                mlmg_hibc[idim] = MLLinOp::BCType::Neumann;
            }
        }
    }
}